

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O3

ROOM_AFFECT_DATA * new_affect_room(void)

{
  ROOM_AFFECT_DATA *pRVar1;
  
  if (raffect_free == (ROOM_AFFECT_DATA *)0x0) {
    pRVar1 = (ROOM_AFFECT_DATA *)operator_new(0x50);
  }
  else {
    pRVar1 = raffect_free;
    raffect_free = raffect_free->next;
  }
  pRVar1->valid = false;
  pRVar1->field_0x11 = 0;
  pRVar1->where = 0;
  pRVar1->type = 0;
  pRVar1->level = 0;
  pRVar1->duration = 0;
  pRVar1->location = 0;
  pRVar1->modifier = 0;
  *(undefined2 *)&pRVar1->field_0x1e = 0;
  pRVar1->tick_fun = (RAFF_FUN *)0x0;
  pRVar1->end_fun = (RAFF_FUN *)0x0;
  *(undefined8 *)&pRVar1->aftype = 0;
  pRVar1->pulse_fun = (RAFF_FUN *)0x0;
  pRVar1->bitvector[0] = 0;
  pRVar1->bitvector[1] = 0;
  pRVar1->next = (ROOM_AFFECT_DATA *)0x0;
  pRVar1->owner = (CHAR_DATA *)0x0;
  pRVar1->valid = true;
  return pRVar1;
}

Assistant:

ROOM_AFFECT_DATA *new_affect_room(void)
{
	static ROOM_AFFECT_DATA af_zero;
	ROOM_AFFECT_DATA *af;

	if (raffect_free == nullptr)
	{
		af = new ROOM_AFFECT_DATA;
	}
	else
	{
		af = raffect_free;
		raffect_free = raffect_free->next;
	}

	*af = af_zero;

	af->valid = true;
	return af;
}